

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.cpp
# Opt level: O1

void __thiscall warrior::addKill(warrior *this,entity *zombieKilled)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  string labels [3];
  undefined1 *local_88;
  long lStack_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  iVar1 = entity::getSize(zombieKilled);
  this->score = this->score + *(int *)(&DAT_0010718c + (long)iVar1 * 4);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Small Zombie","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Medium Zombie","");
  plVar3 = local_38;
  local_48[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Large Zombie","");
  if ((this->killList)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->killList);
  }
  lVar4 = (long)iVar1 + -1;
  std::__cxx11::string::_M_append((char *)&this->killList,(ulong)(&local_88)[lVar4 * 4]);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(&local_88)[lVar4 * 4],(&lStack_80)[lVar4 * 4]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Slain!\n",8);
  lVar4 = -0x60;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

void warrior::addKill(entity *zombieKilled) {
    //function to automatically update score and killList from zombie entity
    //also will keep track of katana Leveling
    //note: as of writing, the function will also delete zombie object, may change later

    int size = zombieKilled->getSize() - 1;
    int scores[3] = {50, 75, 100};
    addScore(scores[size]);

    std::string labels[3] = {"Small Zombie", "Medium Zombie", "Large Zombie"};
    if (!killList.empty())
        killList += ",";

    killList += labels[size];

    std::cout << labels[size] << " Slain!\n";
}